

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O2

xmlParserErrors xmlSaveFinish(xmlSaveCtxtPtr ctxt)

{
  int iVar1;
  xmlParserErrors xVar2;
  
  if (ctxt == (xmlSaveCtxtPtr)0x0) {
    xVar2 = XML_ERR_INTERNAL_ERROR;
  }
  else {
    iVar1 = xmlOutputBufferClose(ctxt->buf);
    ctxt->buf = (xmlOutputBufferPtr)0x0;
    xVar2 = iVar1 >> 0x1f & -iVar1;
    xmlFreeSaveCtxt(ctxt);
  }
  return xVar2;
}

Assistant:

xmlParserErrors
xmlSaveFinish(xmlSaveCtxtPtr ctxt)
{
    int ret;

    if (ctxt == NULL)
        return(XML_ERR_INTERNAL_ERROR);

    ret = xmlOutputBufferClose(ctxt->buf);
    ctxt->buf = NULL;
    if (ret < 0)
        ret = -ret;
    else
        ret = XML_ERR_OK;

    xmlFreeSaveCtxt(ctxt);
    return(ret);
}